

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_user(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  char *local_40;
  ftp_conn *ftpc;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (conn->user == (char *)0x0) {
    local_40 = "";
  }
  else {
    local_40 = conn->user;
  }
  CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"USER %s",local_40);
  if (CVar1 == CURLE_OK) {
    *(byte *)((long)&conn->proto + 0xf0) = *(byte *)((long)&conn->proto + 0xf0) & 0xfe;
    _state(data,FTP_USER);
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_state_user(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLcode result = Curl_pp_sendf(data,
                                  &conn->proto.ftpc.pp, "USER %s",
                                  conn->user?conn->user:"");
  if(!result) {
    struct ftp_conn *ftpc = &conn->proto.ftpc;
    ftpc->ftp_trying_alternative = FALSE;
    state(data, FTP_USER);
  }
  return result;
}